

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
mpt::unique_array<mpt::item<mpt::metatype>_>::unique_array
          (unique_array<mpt::item<mpt::metatype>_> *this,long len)

{
  int iVar1;
  type_traits *traits;
  undefined4 extraout_var;
  content<mpt::item<mpt::metatype>_> *local_50;
  content<mpt::item<mpt::metatype>_> *local_30;
  content<mpt::item<mpt::metatype>_> *data;
  long len_local;
  unique_array<mpt::item<mpt::metatype>_> *this_local;
  
  reference<mpt::content<mpt::item<mpt::metatype>_>_>::reference
            (&this->_ref,(content<mpt::item<mpt::metatype>_> *)0x0);
  if (unique_array<mpt::item<mpt::metatype>>::unique_array(long)::_dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&unique_array<mpt::item<mpt::metatype>>::unique_array(long)::_dummy)
    ;
    if (iVar1 != 0) {
      traits = type_properties<mpt::item<mpt::metatype>_>::traits();
      default_data::default_data(&unique_array::_dummy,traits);
      __cxa_atexit(default_data::~default_data,&unique_array::_dummy,&__dso_handle);
      __cxa_guard_release(&unique_array<mpt::item<mpt::metatype>>::unique_array(long)::_dummy);
    }
  }
  local_30 = &unique_array::_dummy.super_content<mpt::item<mpt::metatype>_>;
  if (-1 < len) {
    iVar1 = (*unique_array::_dummy.super_content<mpt::item<mpt::metatype>_>.super_buffer.
              _vptr_buffer[3])(&unique_array::_dummy,len << 5);
    local_30 = (content<mpt::item<mpt::metatype>_> *)CONCAT44(extraout_var,iVar1);
  }
  if (local_30 == (content<mpt::item<mpt::metatype>_> *)0x0) {
    local_50 = &unique_array::_dummy.super_content<mpt::item<mpt::metatype>_>;
  }
  else {
    local_50 = local_30;
  }
  reference<mpt::content<mpt::item<mpt::metatype>_>_>::set_instance(&this->_ref,local_50);
  return;
}

Assistant:

unique_array(long len = -1)
	{
		static default_data _dummy;
		content<T> *data = &_dummy;
		if (len >= 0) data = data->detach(len * sizeof(T));
		_ref.set_instance(data ? data : &_dummy);
	}